

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int __thiscall iqnet::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  network_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_41;
  string local_40;
  SystemSockAddrIn *local_20;
  sockaddr *saddr;
  Inet_addr *addr_local;
  Socket *this_local;
  
  saddr = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  addr_local = (Inet_addr *)this;
  local_20 = Inet_addr::get_sockaddr((Inet_addr *)saddr);
  iVar1 = ::bind(this->sock,(sockaddr *)local_20,0x10);
  if (iVar1 == -1) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Socket::bind",&local_41)
    ;
    network_error::network_error(this_00,&local_40,true,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return iVar1;
}

Assistant:

void Socket::bind( const Inet_addr& addr )
{
  const sockaddr* saddr = reinterpret_cast<const sockaddr*>(addr.get_sockaddr());

  if( ::bind( sock, saddr, sizeof(sockaddr_in) ) == -1 )
    throw network_error( "Socket::bind" );
}